

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void onpayload(uint8_t *data,uint32_t sz,i2cp_state *st,void *user)

{
  _Bool _Var1;
  uint16_t uVar2;
  uint32_t uVar3;
  i2cp_payload *p;
  ringbuf *in_RCX;
  packet_state *in_RDX;
  uint in_ESI;
  long in_RDI;
  uint16_t ippkt_sz;
  uint16_t sid;
  uint8_t *buf;
  trans2p *t;
  undefined6 in_stack_ffffffffffffffc8;
  ringbuf *b;
  
  b = in_RCX;
  uVar2 = bufbe16toh((void *)0x113e95);
  if (uVar2 != *(uint16_t *)((long)&in_RDX->dns + 2)) {
    __assert_fail("sid == st->sid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/main.c"
                  ,0x86,"void onpayload(uint8_t *, uint32_t, struct i2cp_state *, void *)");
  }
  in_RDI = in_RDI + 6;
  uVar3 = bufbe32toh((void *)0x113ef3);
  *(uint32_t *)(in_RCX[2].buffs[0x12].buf + 0x1bb6) = uVar3;
  if (in_ESI < *(uint *)(in_RCX[2].buffs[0x12].buf + 0x1bb6)) {
    printf("i2cp payload overflow: %d > %d\n",(ulong)*(uint *)(in_RCX[2].buffs[0x12].buf + 0x1bb6),
           (ulong)in_ESI);
  }
  else {
    p = (i2cp_payload *)(in_RDI + 4);
    *(i2cp_payload **)(in_RCX[2].buffs[0x12].buf + 0x1bae) = p;
    _Var1 = i2cp_parse_payload(p);
    if (_Var1) {
      _Var1 = translate_i2cp_to_ip
                        (in_RDX,(i2cp_payload *)b,(uint8_t *)in_RCX,(size_t)p,
                         (uint16_t *)CONCAT26(uVar2,in_stack_ffffffffffffffc8));
      if (_Var1) {
        ringbuf_append(b,(uint8_t *)in_RCX,(uint16_t)((ulong)p >> 0x30));
      }
      else {
        printf("dropping i2cp message, cannot translate\n");
      }
    }
    else {
      printf("invalid i2cp payload\n");
    }
  }
  return;
}

Assistant:

void onpayload(uint8_t * data, uint32_t sz, struct i2cp_state * st, void * user)
{
  struct trans2p * t = user;
  uint8_t * buf = data;
  // session id
  uint16_t sid = bufbe16toh(buf);
  buf += 2;
  assert(sid == st->sid);
  // msgid
  buf += 4;
  // payload header
  t->payload.ptrlen = bufbe32toh(buf);
  if(t->payload.ptrlen > sz)
  {
    printf("i2cp payload overflow: %d > %d\n", t->payload.ptrlen, sz);
    return;
  }
  buf += 4;
  // payload 
  t->payload.ptr = buf;
  if(i2cp_parse_payload(&t->payload))
  {
    uint16_t ippkt_sz;
    if(translate_i2cp_to_ip(&t->pkt, &t->payload, t->buf, sizeof(t->buf), &ippkt_sz))
    {
      ringbuf_append(&t->tun.write, t->buf, ippkt_sz);
    }
    else
      printf("dropping i2cp message, cannot translate\n");
  }
  else
  {
    printf("invalid i2cp payload\n");
  }
}